

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O2

RefAST __thiscall ASTFactory::create(ASTFactory *this,RefToken *tok)

{
  long *in_RDX;
  AST *this_00;
  RefToken local_18;
  
  (*(code *)tok->ref->ptr)();
  if (this->_vptr_ASTFactory == (_func_int **)0x0) {
    this_00 = (AST *)0x0;
  }
  else {
    this_00 = (AST *)*this->_vptr_ASTFactory;
  }
  local_18.ref = (Ref *)*in_RDX;
  if (local_18.ref != (Ref *)0x0) {
    (local_18.ref)->count = (local_18.ref)->count + 1;
  }
  AST::initialize(this_00,&local_18);
  RefCount<Token>::~RefCount(&local_18);
  return (RefAST)(Ref *)this;
}

Assistant:

RefAST ASTFactory::create(RefToken tok)
{
	RefAST t = create();
	t->initialize(tok);
	return t;
}